

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

bool __thiscall
httplib::SSLClient::process_socket
          (SSLClient *this,Socket *socket,function<bool_(httplib::Stream_&)> *callback)

{
  _Invoker_type p_Var1;
  _Manager_type p_Var2;
  bool bVar3;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  Stream local_48;
  socket_t local_40;
  SSL *local_38;
  time_t local_30;
  time_t tStack_28;
  time_t local_20;
  time_t tStack_18;
  
  local_38 = (SSL *)socket->ssl;
  local_40 = socket->sock;
  local_30 = (this->super_ClientImpl).read_timeout_sec_;
  tStack_28 = (this->super_ClientImpl).read_timeout_usec_;
  local_20 = (this->super_ClientImpl).write_timeout_sec_;
  tStack_18 = (this->super_ClientImpl).write_timeout_usec_;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_58 = (_Manager_type)0x0;
  p_Var1 = callback->_M_invoker;
  p_Var2 = (callback->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_68._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_68._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_58 = p_Var2;
  }
  local_48._vptr_Stream = (_func_int **)&PTR__Stream_0019f400;
  local_50 = p_Var1;
  SSL_ctrl(local_38,0x4e,4,(void *)0x0);
  if (p_Var2 != (_Manager_type)0x0) {
    bVar3 = (*p_Var1)(&local_68,&local_48);
    if (local_58 != (_Manager_type)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    return bVar3;
  }
  std::__throw_bad_function_call();
}

Assistant:

inline bool
        SSLClient::process_socket(const Socket & socket,
            std::function<bool(Stream& strm)> callback) {
        assert(socket.ssl);
        return detail::process_client_socket_ssl(
            socket.ssl, socket.sock, read_timeout_sec_, read_timeout_usec_,
            write_timeout_sec_, write_timeout_usec_, std::move(callback));
    }